

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O1

bool __thiscall
cmProjectCommand::InitialPass
          (cmProjectCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  char *pcVar9;
  ostream *poVar10;
  long *plVar11;
  char *filename;
  size_type *psVar12;
  PolicyID id;
  size_type sVar13;
  pointer pbVar14;
  _Alloc_hider _Var15;
  long lVar16;
  ulong uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  string *psVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string vv;
  string vs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string extraInclude;
  string bindir;
  string srcdir;
  string version;
  uint v [4];
  RegularExpression vx;
  string local_388;
  undefined1 local_368 [40];
  string local_340;
  cmCommand *local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  undefined1 local_2f8 [64];
  char local_2b8 [48];
  ios_base local_288 [16];
  char local_278 [64];
  char local_238 [192];
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  uint local_118;
  undefined1 auStack_114 [4];
  undefined8 uStack_110;
  undefined1 local_100 [184];
  char *local_48;
  
  psVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == psVar19) {
    local_2f8._0_8_ = local_2f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f8,"PROJECT called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_2f8);
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    return false;
  }
  cmMakefile::SetProjectName((this->super_cmCommand).Makefile,psVar19);
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  pcVar1 = (pbVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar1,pcVar1 + pbVar14->_M_string_length);
  std::__cxx11::string::append((char *)&local_178);
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  pcVar1 = (pbVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar1,pcVar1 + pbVar14->_M_string_length);
  std::__cxx11::string::append((char *)&local_158);
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar9 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
  cmMakefile::AddCacheDefinition(pcVar2,&local_178,pcVar9,"Value Computed by CMake",STATIC,false);
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar9 = cmMakefile::GetCurrentSourceDirectory(pcVar2);
  cmMakefile::AddCacheDefinition(pcVar2,&local_158,pcVar9,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::_M_replace((ulong)&local_178,0,(char *)local_178._M_string_length,0x4cf080);
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)local_158._M_string_length,0x4cf093);
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar9 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
  cmMakefile::AddDefinition(pcVar2,&local_178,pcVar9);
  pcVar2 = (this->super_cmCommand).Makefile;
  pcVar9 = cmMakefile::GetCurrentSourceDirectory(pcVar2);
  cmMakefile::AddDefinition(pcVar2,&local_158,pcVar9);
  pcVar2 = (this->super_cmCommand).Makefile;
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2f8 + 0x10);
  local_2f8._0_8_ = paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"PROJECT_NAME","");
  cmMakefile::AddDefinition
            (pcVar2,(string *)local_2f8,
             (((args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != paVar18) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_2f8._0_8_ = paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"CMAKE_PROJECT_NAME","");
  pcVar9 = cmMakefile::GetDefinition(pcVar2,(string *)local_2f8);
  if (pcVar9 == (char *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
LAB_002bf4e1:
    pcVar2 = (this->super_cmCommand).Makefile;
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"CMAKE_PROJECT_NAME","");
    cmMakefile::AddDefinition
              (pcVar2,(string *)local_2f8,
               (((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"CMAKE_PROJECT_NAME","");
    cmMakefile::AddCacheDefinition
              (pcVar2,(string *)local_2f8,
               (((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
               "Value Computed by CMake",STATIC,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
  }
  else {
    bVar6 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    if (bVar6) goto LAB_002bf4e1;
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  bVar3 = false;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar6 = false;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
    uVar17 = 1;
    lVar16 = 0x20;
    bVar6 = false;
    local_320 = &this->super_cmCommand;
    bVar5 = false;
    bVar4 = bVar3;
    do {
      bVar3 = bVar5;
      iVar7 = std::__cxx11::string::compare((char *)((long)&(pbVar14->_M_dataplus)._M_p + lVar16));
      if (iVar7 == 0) {
        if (bVar3) {
          pcVar2 = local_320->Makefile;
          local_2f8._0_8_ = local_2f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2f8,"LANGUAGES may be specified at most once.","");
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_2f8,false);
          goto LAB_002c02aa;
        }
        bVar3 = true;
LAB_002bf672:
        bVar4 = false;
      }
      else {
        iVar7 = std::__cxx11::string::compare
                          ((char *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar16));
        if (iVar7 != 0) {
          if (bVar4) {
            std::__cxx11::string::_M_assign((string *)&local_138);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_318,
                        (value_type *)
                        ((long)&(((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar16));
          }
          goto LAB_002bf672;
        }
        if (bVar6) {
          pcVar2 = local_320->Makefile;
          local_2f8._0_8_ = local_2f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2f8,"VERSION may be specified at most once.","");
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_2f8,false);
          goto LAB_002c02aa;
        }
        bVar6 = true;
        bVar4 = true;
      }
      uVar17 = uVar17 + 1;
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x20;
      this = (cmProjectCommand *)local_320;
      bVar5 = bVar3;
    } while (uVar17 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5
                             ));
  }
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2f8 + 0x10);
  if ((bVar6 == true && !bVar3) &&
     (local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pcVar2 = (this->super_cmCommand).Makefile;
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f8,"project with VERSION must use LANGUAGES before language names.",
               "");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_2f8,false);
LAB_002c02aa:
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    cmSystemTools::s_FatalErrorOccured = true;
    bVar3 = true;
    goto LAB_002c0601;
  }
  if ((bVar3) &&
     (local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"NONE","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
  }
  PVar8 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0048);
  if (bVar6) {
    if (PVar8 < NEW) {
      pcVar2 = (this->super_cmCommand).Makefile;
      local_2f8._0_8_ = paVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,"VERSION not allowed unless CMP0048 is set to NEW","");
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_2f8,false);
      goto LAB_002c02aa;
    }
    local_48 = (char *)0x0;
    cmsys::RegularExpression::compile
              ((RegularExpression *)local_100,"^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
    bVar6 = cmsys::RegularExpression::find
                      ((RegularExpression *)local_100,local_138._M_dataplus._M_p);
    if (bVar6) {
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      local_340._M_string_length = 0;
      local_340.field_2._M_local_buf[0] = '\0';
      _local_118 = 0;
      uStack_110 = 0;
      local_320 = &this->super_cmCommand;
      iVar7 = __isoc99_sscanf(local_138._M_dataplus._M_p,"%u.%u.%u.%u",&local_118,auStack_114,
                              &uStack_110,(long)&uStack_110 + 4);
      lVar16 = 0;
      pcVar9 = local_2f8;
      do {
        if (lVar16 < iVar7) {
          sprintf(pcVar9,"%u",(ulong)(&local_118)[lVar16]);
          std::__cxx11::string::append((char *)&local_340);
          std::__cxx11::string::append((char *)&local_340);
        }
        else {
          *pcVar9 = '\0';
        }
        lVar16 = lVar16 + 1;
        pcVar9 = pcVar9 + 0x40;
      } while (lVar16 != 4);
      local_368._8_8_ = (string *)0x0;
      local_368._16_8_ = local_368._16_8_ & 0xffffffffffffff00;
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      paVar18 = &local_388.field_2;
      pcVar1 = (pbVar14->_M_dataplus)._M_p;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      local_368._0_8_ = (string *)(local_368 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar1,pcVar1 + pbVar14->_M_string_length);
      std::__cxx11::string::append((char *)&local_388);
      this = (cmProjectCommand *)local_320;
      std::__cxx11::string::operator=((string *)local_368,(string *)&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"PROJECT_VERSION","");
      cmMakefile::AddDefinition(pcVar2,&local_388,local_340._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,(string *)local_368,local_340._M_dataplus._M_p);
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (pbVar14->_M_dataplus)._M_p;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar1,pcVar1 + pbVar14->_M_string_length);
      std::__cxx11::string::append((char *)&local_388);
      std::__cxx11::string::operator=((string *)local_368,(string *)&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_388,"PROJECT_VERSION_MAJOR","");
      cmMakefile::AddDefinition(pcVar2,&local_388,local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_368,local_2f8);
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (pbVar14->_M_dataplus)._M_p;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar1,pcVar1 + pbVar14->_M_string_length);
      std::__cxx11::string::append((char *)&local_388);
      std::__cxx11::string::operator=((string *)local_368,(string *)&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_388,"PROJECT_VERSION_MINOR","");
      cmMakefile::AddDefinition(pcVar2,&local_388,local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_368,local_2b8);
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (pbVar14->_M_dataplus)._M_p;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar1,pcVar1 + pbVar14->_M_string_length);
      std::__cxx11::string::append((char *)&local_388);
      std::__cxx11::string::operator=((string *)local_368,(string *)&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_388,"PROJECT_VERSION_PATCH","");
      cmMakefile::AddDefinition(pcVar2,&local_388,local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_368,local_278);
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (pbVar14->_M_dataplus)._M_p;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar1,pcVar1 + pbVar14->_M_string_length);
      std::__cxx11::string::append((char *)&local_388);
      std::__cxx11::string::operator=((string *)local_368,(string *)&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      local_388._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_388,"PROJECT_VERSION_TWEAK","");
      cmMakefile::AddDefinition(pcVar2,&local_388,local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar18) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_368,local_238);
      if ((string *)local_368._0_8_ != (string *)(local_368 + 0x10)) {
        operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        sVar13 = CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                          local_340.field_2._M_local_buf[0]);
        _Var15._M_p = local_340._M_dataplus._M_p;
LAB_002c03a3:
        operator_delete(_Var15._M_p,sVar13 + 1);
      }
    }
    else {
      std::operator+(&local_340,"VERSION \"",&local_138);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_340);
      psVar12 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_2f8._16_8_ = *psVar12;
        local_2f8._24_8_ = plVar11[3];
        local_2f8._0_8_ = paVar18;
      }
      else {
        local_2f8._16_8_ = *psVar12;
        local_2f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar11;
      }
      local_2f8._8_8_ = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                 local_340.field_2._M_local_buf[0]) + 1);
      }
      cmMakefile::IssueMessage
                ((this->super_cmCommand).Makefile,FATAL_ERROR,(string *)local_2f8,false);
      cmSystemTools::s_FatalErrorOccured = true;
      sVar13 = local_2f8._16_8_;
      _Var15._M_p = (pointer)local_2f8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != paVar18) goto LAB_002c03a3;
    }
    if (local_48 != (char *)0x0) {
      operator_delete__(local_48);
    }
    bVar3 = true;
    if (!bVar6) goto LAB_002c0601;
  }
  else if (PVar8 != OLD) {
    local_368._0_8_ = (string *)0x0;
    local_368._8_8_ = (string *)0x0;
    local_368._16_8_ = (pointer)0x0;
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"PROJECT_VERSION","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"PROJECT_VERSION_MAJOR","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"PROJECT_VERSION_MINOR","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"PROJECT_VERSION_PATCH","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"PROJECT_VERSION_TWEAK","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (pbVar14->_M_dataplus)._M_p;
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2f8,pcVar1,pcVar1 + pbVar14->_M_string_length);
    std::__cxx11::string::append(local_2f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (pbVar14->_M_dataplus)._M_p;
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2f8,pcVar1,pcVar1 + pbVar14->_M_string_length);
    std::__cxx11::string::append(local_2f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (pbVar14->_M_dataplus)._M_p;
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2f8,pcVar1,pcVar1 + pbVar14->_M_string_length);
    std::__cxx11::string::append(local_2f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (pbVar14->_M_dataplus)._M_p;
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2f8,pcVar1,pcVar1 + pbVar14->_M_string_length);
    std::__cxx11::string::append(local_2f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (pbVar14->_M_dataplus)._M_p;
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2f8,pcVar1,pcVar1 + pbVar14->_M_string_length);
    std::__cxx11::string::append(local_2f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    local_100._0_8_ = local_100 + 0x10;
    local_100._8_8_ = (char *)0x0;
    local_100[0x10] = '\0';
    if (local_368._0_8_ != local_368._8_8_) {
      psVar19 = (string *)local_368._0_8_;
      do {
        pcVar9 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,psVar19);
        if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
          if (PVar8 == WARN) {
            std::__cxx11::string::append(local_100);
            std::__cxx11::string::_M_append(local_100,(ulong)(psVar19->_M_dataplus)._M_p);
          }
          else {
            cmMakefile::AddDefinition((this->super_cmCommand).Makefile,psVar19,"");
          }
        }
        psVar19 = psVar19 + 1;
      } while (psVar19 != (string *)local_368._8_8_);
    }
    if ((char *)local_100._8_8_ != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_340,(cmPolicies *)0x30,id);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,local_340._M_dataplus._M_p,
                           local_340._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"\nThe following variable(s) would be set to empty:",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(char *)local_100._0_8_,local_100._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                 local_340.field_2._M_local_buf[0]) + 1);
      }
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_340,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,
                        CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                                 local_340.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
      std::ios_base::~ios_base(local_288);
    }
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_368);
  }
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2f8 + 0x10);
  if (local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"C","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    local_2f8._0_8_ = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"CXX","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != paVar18) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
  }
  cmMakefile::EnableLanguage((this->super_cmCommand).Makefile,&local_318,false);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 "CMAKE_PROJECT_",
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  plVar11 = (long *)std::__cxx11::string::append(local_100);
  psVar12 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2f8._16_8_ = *psVar12;
    local_2f8._24_8_ = plVar11[3];
    local_2f8._0_8_ = paVar18;
  }
  else {
    local_2f8._16_8_ = *psVar12;
    local_2f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar11;
  }
  local_2f8._8_8_ = plVar11[1];
  *plVar11 = (long)psVar12;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  pcVar9 = local_100 + 0x10;
  if ((char *)local_100._0_8_ != pcVar9) {
    operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
  }
  filename = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,(string *)local_2f8);
  if (filename == (char *)0x0) {
LAB_002c05e1:
    bVar3 = true;
  }
  else {
    bVar6 = cmMakefile::ReadDependentFile((this->super_cmCommand).Makefile,filename,true);
    bVar3 = true;
    if (((!bVar6) && (cmSystemTools::s_FatalErrorOccured == false)) &&
       (bVar6 = cmSystemTools::GetInterruptFlag(), !bVar6)) {
      local_100._0_8_ = pcVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"could not find file:\n  ","");
      std::__cxx11::string::append(local_100);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_100);
      if ((char *)local_100._0_8_ != pcVar9) {
        operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
      }
      bVar3 = false;
    }
    if (bVar3) goto LAB_002c05e1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != paVar18) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
LAB_002c0601:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmProjectCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("PROJECT called with incorrect number of arguments");
    return false;
    }
  this->Makefile->SetProjectName(args[0]);

  std::string bindir = args[0];
  bindir += "_BINARY_DIR";
  std::string srcdir = args[0];
  srcdir += "_SOURCE_DIR";

  this->Makefile->AddCacheDefinition
    (bindir,
     this->Makefile->GetCurrentBinaryDirectory(),
     "Value Computed by CMake", cmState::STATIC);
  this->Makefile->AddCacheDefinition
    (srcdir,
     this->Makefile->GetCurrentSourceDirectory(),
     "Value Computed by CMake", cmState::STATIC);

  bindir = "PROJECT_BINARY_DIR";
  srcdir = "PROJECT_SOURCE_DIR";

  this->Makefile->AddDefinition(bindir,
          this->Makefile->GetCurrentBinaryDirectory());
  this->Makefile->AddDefinition(srcdir,
          this->Makefile->GetCurrentSourceDirectory());

  this->Makefile->AddDefinition("PROJECT_NAME", args[0].c_str());

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if(!this->Makefile->GetDefinition("CMAKE_PROJECT_NAME")
     || (this->Makefile->IsRootMakefile()))
    {
    this->Makefile->AddDefinition("CMAKE_PROJECT_NAME", args[0].c_str());
    this->Makefile->AddCacheDefinition
      ("CMAKE_PROJECT_NAME",
       args[0].c_str(),
       "Value Computed by CMake", cmState::STATIC);
    }

  bool haveVersion = false;
  bool haveLanguages = false;
  std::string version;
  std::vector<std::string> languages;
  enum Doing { DoingLanguages, DoingVersion };
  Doing doing = DoingLanguages;
  for(size_t i = 1; i < args.size(); ++i)
    {
    if(args[i] == "LANGUAGES")
      {
      if(haveLanguages)
        {
        this->Makefile->IssueMessage
          (cmake::FATAL_ERROR, "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
        }
      haveLanguages = true;
      doing = DoingLanguages;
      }
    else if (args[i] == "VERSION")
      {
      if(haveVersion)
        {
        this->Makefile->IssueMessage
          (cmake::FATAL_ERROR, "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
        }
      haveVersion = true;
      doing = DoingVersion;
      }
    else if(doing == DoingVersion)
      {
      doing = DoingLanguages;
      version = args[i];
      }
    else // doing == DoingLanguages
      {
      languages.push_back(args[i]);
      }
    }

  if (haveVersion && !haveLanguages && !languages.empty())
    {
    this->Makefile->IssueMessage
      (cmake::FATAL_ERROR,
       "project with VERSION must use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
    }
  if (haveLanguages && languages.empty())
    {
    languages.push_back("NONE");
    }

  cmPolicies::PolicyStatus cmp0048 =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion)
    {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD ||
        cmp0048 == cmPolicies::WARN)
      {
      this->Makefile->IssueMessage
        (cmake::FATAL_ERROR,
         "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccured();
      return true;
      }

    cmsys::RegularExpression
      vx("^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
    if(!vx.find(version))
      {
      std::string e = "VERSION \"" + version + "\" format invalid.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccured();
      return true;
      }

    std::string vs;
    const char* sep = "";
    char vb[4][64];
    unsigned int v[4] = {0,0,0,0};
    int vc = sscanf(version.c_str(), "%u.%u.%u.%u",
                    &v[0], &v[1], &v[2], &v[3]);
    for(int i=0; i < 4; ++i)
      {
      if(i < vc)
        {
        sprintf(vb[i], "%u", v[i]);
        vs += sep;
        vs += vb[i];
        sep = ".";
        }
      else
        {
        vb[i][0] = 0;
        }
      }

    std::string vv;
    vv = args[0] + "_VERSION";
    this->Makefile->AddDefinition("PROJECT_VERSION", vs.c_str());
    this->Makefile->AddDefinition(vv, vs.c_str());
    vv = args[0] + "_VERSION_MAJOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MAJOR", vb[0]);
    this->Makefile->AddDefinition(vv, vb[0]);
    vv = args[0] + "_VERSION_MINOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MINOR", vb[1]);
    this->Makefile->AddDefinition(vv, vb[1]);
    vv = args[0] + "_VERSION_PATCH";
    this->Makefile->AddDefinition("PROJECT_VERSION_PATCH", vb[2]);
    this->Makefile->AddDefinition(vv, vb[2]);
    vv = args[0] + "_VERSION_TWEAK";
    this->Makefile->AddDefinition("PROJECT_VERSION_TWEAK", vb[3]);
    this->Makefile->AddDefinition(vv, vb[3]);
    }
  else if(cmp0048 != cmPolicies::OLD)
    {
    // Set project VERSION variables to empty
    std::vector<std::string> vv;
    vv.push_back("PROJECT_VERSION");
    vv.push_back("PROJECT_VERSION_MAJOR");
    vv.push_back("PROJECT_VERSION_MINOR");
    vv.push_back("PROJECT_VERSION_PATCH");
    vv.push_back("PROJECT_VERSION_TWEAK");
    vv.push_back(args[0] + "_VERSION");
    vv.push_back(args[0] + "_VERSION_MAJOR");
    vv.push_back(args[0] + "_VERSION_MINOR");
    vv.push_back(args[0] + "_VERSION_PATCH");
    vv.push_back(args[0] + "_VERSION_TWEAK");
    std::string vw;
    for(std::vector<std::string>::iterator i = vv.begin();
        i != vv.end(); ++i)
      {
      const char* v = this->Makefile->GetDefinition(*i);
      if(v && *v)
        {
        if(cmp0048 == cmPolicies::WARN)
          {
          vw += "\n  ";
          vw += *i;
          }
        else
          {
          this->Makefile->AddDefinition(*i, "");
          }
        }
      }
    if(!vw.empty())
      {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0048)
        << "\nThe following variable(s) would be set to empty:" << vw;
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      }
    }

  if (languages.empty())
    {
    // if no language is specified do c and c++
    languages.push_back("C");
    languages.push_back("CXX");
    }
  this->Makefile->EnableLanguage(languages, false);
  std::string extraInclude = "CMAKE_PROJECT_" + args[0] + "_INCLUDE";
  const char* include = this->Makefile->GetDefinition(extraInclude);
  if(include)
    {
    bool readit =
      this->Makefile->ReadDependentFile(include);
    if(!readit && !cmSystemTools::GetFatalErrorOccured())
      {
      std::string m =
        "could not find file:\n"
        "  ";
      m += include;
      this->SetError(m);
      return false;
      }
    }
  return true;
}